

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void __thiscall CVmPackType::CVmPackType(CVmPackType *this)

{
  CVmPackPos *in_RDI;
  
  CVmPackPos::CVmPackPos(in_RDI);
  *(undefined4 *)&(in_RDI->p).p_ = 0;
  *(undefined4 *)&in_RDI[1].len = 0;
  *(undefined4 *)((long)&in_RDI[1].len + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[1].field_0x14 = 0;
  in_RDI[1].idx = 0;
  *(undefined4 *)&in_RDI[2].p.p_ = 0;
  *(undefined4 *)((long)&in_RDI[2].p.p_ + 4) = 0;
  *(undefined4 *)&in_RDI[2].len = 0;
  *(undefined4 *)((long)&in_RDI[2].len + 4) = 0;
  *(undefined4 *)&in_RDI[3].p.p_ = 0;
  *(undefined4 *)&in_RDI[2].field_0x14 = 0;
  in_RDI[2].idx = 0;
  return;
}

Assistant:

CVmPackType()
    {
        type_code = 0;
        big_endian = FALSE;
        count = ITER_NONE;
        count_as_type = 0;
        count_in_bytes = FALSE;
        up_to_count = FALSE;
        bang = FALSE;
        tilde = FALSE;
        pct = FALSE;
        fmtidx = 0;
        null_term = FALSE;
        qu = FALSE;
    }